

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_ncell(REF_CELL ref_cell,REF_NODE ref_node,REF_LONG *ncell)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT part;
  REF_INT cell;
  REF_MPI ref_mpi;
  REF_LONG *ncell_local;
  REF_NODE ref_node_local;
  REF_CELL ref_cell_local;
  
  _part = ref_node->ref_mpi;
  *ncell = 0;
  ref_private_macro_code_rss = 0;
  ref_mpi = (REF_MPI)ncell;
  ncell_local = (REF_LONG *)ref_node;
  ref_node_local = (REF_NODE)ref_cell;
  do {
    if (*(int *)((long)&ref_node_local->part + 4) <= ref_private_macro_code_rss) {
      ref_cell_local._4_4_ = ref_mpi_allsum(_part,ref_mpi,1,2);
      if (ref_cell_local._4_4_ == 0) {
        ref_cell_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x3d3,"ref_cell_ncell",(ulong)ref_cell_local._4_4_,"sum");
      }
      return ref_cell_local._4_4_;
    }
    if (((-1 < ref_private_macro_code_rss) &&
        (ref_private_macro_code_rss < *(int *)((long)&ref_node_local->part + 4))) &&
       (*(int *)((long)ref_node_local->real +
                (long)(ref_node_local->blank * ref_private_macro_code_rss) * 4) != -1)) {
      uVar1 = ref_cell_part((REF_CELL)ref_node_local,(REF_NODE)ncell_local,
                            ref_private_macro_code_rss,&ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x3cd,"ref_cell_ncell",(ulong)uVar1,"cell part");
        return uVar1;
      }
      if (_part->id == ref_private_macro_code_rss_1) {
        *(long *)ref_mpi = *(long *)ref_mpi + 1;
      }
    }
    ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_ncell(REF_CELL ref_cell, REF_NODE ref_node,
                                  REF_LONG *ncell) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, part;

  *ncell = 0;
  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (ref_mpi_rank(ref_mpi) == part) {
      (*ncell)++;
    }
  }

  RSS(ref_mpi_allsum(ref_mpi, ncell, 1, REF_LONG_TYPE), "sum");

  return REF_SUCCESS;
}